

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O2

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::read_perseus_style_file
          (Bitmap_cubical_complex_base<double> *this,char *perseus_style_file)

{
  double dVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  string *psVar5;
  unsigned_long __val;
  size_t i;
  ulong uVar6;
  unsigned_long __val_00;
  uint dimensionOfData;
  string line;
  double filtrationLevel;
  Top_dimensional_cells_iterator it;
  string perseus_error;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Top_dimensional_cells_iterator local_258;
  ifstream inFiltration;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&inFiltration,perseus_style_file,_S_in);
  if ((abStack_218[*(long *)(_inFiltration + -0x18)] & 5) != 0) {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&line,"Could not open the file ",(allocator<char> *)&perseus_error);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,&line,
                   perseus_style_file);
    std::ios_base::failure[abi:cxx11]::failure(psVar5);
    __cxa_throw(psVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
  std::istream::_M_extract<unsigned_int>((uint *)&inFiltration);
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&sizes,(ulong)dimensionOfData);
  __val_00 = 1;
  for (uVar6 = 0; uVar6 != dimensionOfData; uVar6 = uVar6 + 1) {
    std::istream::_M_extract<unsigned_int>((uint *)&inFiltration);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&sizes,(value_type *)&it);
    __val_00 = __val_00 *
               (uint)it.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
  }
  set_up_containers(this,&sizes,true);
  Top_dimensional_cells_iterator::Top_dimensional_cells_iterator(&it,this);
  filtrationLevel = 0.0;
  __val = 0;
  do {
    if ((abStack_218[*(long *)(_inFiltration + -0x18)] & 2) != 0) {
      if (__val == __val_00) {
        std::ifstream::close();
        impose_lower_star_filtration(this);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&it);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        std::ifstream::~ifstream(&inFiltration);
        return;
      }
      std::__cxx11::to_string(&local_298,__val);
      std::operator+(&local_278,"Bad Perseus file format. Read ",&local_298);
      std::operator+(&local_2d8,&local_278," expected ");
      std::__cxx11::to_string(&local_2b8,__val_00);
      std::operator+(&perseus_error,&local_2d8,&local_2b8);
      std::operator+(&line,&perseus_error," values");
      std::__cxx11::string::~string((string *)&perseus_error);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      psVar5 = (string *)__cxa_allocate_exception(0x20);
      std::ios_base::failure[abi:cxx11]::failure(psVar5);
      __cxa_throw(psVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&inFiltration,(string *)&line);
    if (line._M_string_length != 0) {
      iVar2 = __isoc99_sscanf(line._M_dataplus._M_p,"%lf",&filtrationLevel);
      dVar1 = filtrationLevel;
      if (iVar2 != 1) {
        std::operator+(&perseus_error,"Bad Perseus file format. This line is incorrect : ",&line);
        pcVar4 = (char *)__cxa_allocate_exception(0x20);
        local_2d8._M_string_length = std::iostream_category();
        local_2d8._M_dataplus._M_p._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar4,(error_code *)perseus_error._M_dataplus._M_p);
        __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      sVar3 = Top_dimensional_cells_iterator::compute_index_in_bitmap(&it);
      (this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar3] = dVar1;
      Top_dimensional_cells_iterator::operator++(&local_258,&it);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_258);
      __val = __val + 1;
    }
    std::__cxx11::string::~string((string *)&line);
  } while( true );
}

Assistant:

void Bitmap_cubical_complex_base<T>::read_perseus_style_file(const char* perseus_style_file) {
  std::ifstream inFiltration(perseus_style_file);
  if(!inFiltration) throw std::ios_base::failure(std::string("Could not open the file ") + perseus_style_file);
  unsigned dimensionOfData;
  inFiltration >> dimensionOfData;

#ifdef DEBUG_TRACES
  std::clog << "dimensionOfData : " << dimensionOfData << std::endl;
#endif

  std::vector<unsigned> sizes;
  sizes.reserve(dimensionOfData);
  // all dimensions multiplied
  std::size_t dimensions = 1;
  for (std::size_t i = 0; i != dimensionOfData; ++i) {
    unsigned size_in_this_dimension;
    inFiltration >> size_in_this_dimension;
    sizes.push_back(size_in_this_dimension);
    dimensions *= size_in_this_dimension;
#ifdef DEBUG_TRACES
    std::clog << "size_in_this_dimension : " << size_in_this_dimension << std::endl;
#endif
  }
  this->set_up_containers(sizes, true);

  Bitmap_cubical_complex_base<T>::Top_dimensional_cells_iterator it = this->top_dimensional_cells_iterator_begin();

  T filtrationLevel = 0.;
  std::size_t filtration_counter = 0;
  while (!inFiltration.eof()) {
    std::string line;
    getline(inFiltration, line);
    if (line.length() != 0) {
      int n = sscanf(line.c_str(), "%lf", &filtrationLevel);
      if (n != 1) {
        std::string perseus_error("Bad Perseus file format. This line is incorrect : " + line);
        throw std::ios_base::failure(perseus_error.c_str());
      }

#ifdef DEBUG_TRACES
      std::clog << "Cell of an index : " << it.compute_index_in_bitmap()
                << " and dimension: " << this->get_dimension_of_a_cell(it.compute_index_in_bitmap())
                << " get the value : " << filtrationLevel << std::endl;
#endif
      this->get_cell_data(*it) = filtrationLevel;
      ++it;
      ++filtration_counter;
    }
  }

  if (filtration_counter != dimensions) {
    std::string perseus_error("Bad Perseus file format. Read " + std::to_string(filtration_counter) + " expected " + \
      std::to_string(dimensions) + " values");
    throw std::ios_base::failure(perseus_error);
  }

  inFiltration.close();
  this->impose_lower_star_filtration();
}